

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O1

pcp_server_state_e log_unexepected_state_event(pcp_server_t *s)

{
  gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
  return pss_set_not_working;
}

Assistant:

static pcp_server_state_e log_unexepected_state_event(pcp_server_t *s) {
    PCP_LOG(PCP_LOGLVL_PERR,
            "Event happened in the state %d on PCP server %s"
            " and there is no event handler defined.",
            s->server_state, s->pcp_server_paddr);

    gettimeofday(&s->next_timeout, NULL);
    return pss_set_not_working;
}